

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclableObject.h
# Opt level: O3

void __thiscall
Js::DynamicObject::InvalidateHasOnlyWritableDataPropertiesInPrototypeChainCacheIfPrototype
          (DynamicObject *this)

{
  Type *pTVar1;
  JavascriptLibrary *pJVar2;
  PrototypeChainCache<Js::OnlyWritablePropertyCache> *local_20;
  
  pTVar1 = (this->super_RecyclableObject).type.ptr;
  if ((*(byte *)(*(long *)(pTVar1 + 1) + 9) & 0x20) != 0) {
    pJVar2 = (pTVar1->javascriptLibrary).ptr;
    Memory::Recycler::WBSetBit((char *)&local_20);
    local_20 = &pJVar2->typesWithOnlyWritablePropertyProtoChain;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_20);
    PrototypeChainCache<Js::OnlyWritablePropertyCache>::Clear(local_20);
  }
  return;
}

Assistant:

inline Type * GetType() const { return type; }